

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

void __thiscall TcpSocket::TcpSocket(TcpSocket *this)

{
  unique_ptr<TcpSocketImpl,_std::default_delete<TcpSocketImpl>_> local_18;
  TcpSocket *local_10;
  TcpSocket *this_local;
  
  local_10 = this;
  BaseSocket::BaseSocket(&this->super_BaseSocket);
  (this->super_BaseSocket)._vptr_BaseSocket = (_func_int **)&PTR__TcpSocket_001b8860;
  std::make_unique<TcpSocketImpl,TcpSocket*>((TcpSocket **)&local_18);
  std::unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>>::operator=
            ((unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>> *)
             &(this->super_BaseSocket).Impl_,&local_18);
  std::unique_ptr<TcpSocketImpl,_std::default_delete<TcpSocketImpl>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

TcpSocket::TcpSocket()
{
    Impl_ = make_unique<TcpSocketImpl>(this);
}